

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptProxy::SetPrototypeTrap
          (JavascriptProxy *this,RecyclableObject *newPrototype,bool shouldThrow,
          ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  ThreadContext *this_00;
  code *pcVar2;
  JavascriptFunction *function;
  bool bVar3;
  BOOL BVar4;
  Attributes attributes;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  RecyclableObject *aRight;
  anon_class_40_5_61b45b38 local_78;
  JavascriptFunction *local_50;
  RecyclableObject *local_48;
  RecyclableObject *local_40;
  byte local_32;
  bool local_31;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  local_48 = newPrototype;
  BVar4 = JavascriptOperators::IsObjectOrNull(newPrototype);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x5fd,"(JavascriptOperators::IsObjectOrNull(newPrototype))",
                                "JavascriptOperators::IsObjectOrNull(newPrototype)");
    if (!bVar3) goto LAB_00ba8d10;
    *puVar7 = 0;
  }
  this_00 = requestContext->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  pRVar8 = MarshalHandler(this,requestContext);
  local_32 = !shouldThrow;
  if (pRVar8 == (RecyclableObject *)0x0 && !(bool)local_32) {
    bVar3 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar3) {
      return 0;
    }
    JavascriptError::ThrowTypeError
              ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ea15,L"setPrototypeOf");
  }
  local_40 = MarshalTarget(this,requestContext);
  local_50 = GetMethodHelper(this,0x19a,requestContext);
  bVar3 = ScriptContext::IsHeapEnumInProgress
                    ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x61f,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar3) {
LAB_00ba8d10:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  aRight = local_48;
  function = local_50;
  if (local_50 == (JavascriptFunction *)0x0) {
    JavascriptObject::ChangePrototype(local_40,local_48,shouldThrow,requestContext);
    return 1;
  }
  local_78.setPrototypeOfMethod = local_50;
  local_78.targetObj = local_40;
  local_78.newPrototype = local_48;
  local_31 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_78.threadContext = this_00;
  local_78.handlerObj = pRVar8;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)local_50);
  bVar3 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar3) {
    pRVar8 = (RecyclableObject *)SetPrototypeTrap::anon_class_40_5_61b45b38::operator()(&local_78);
    bVar3 = ThreadContext::IsOnStack(pRVar8);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      pRVar8 = (((((((((local_50->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                 super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
      goto LAB_00ba8c87;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      pRVar8 = (RecyclableObject *)SetPrototypeTrap::anon_class_40_5_61b45b38::operator()(&local_78)
      ;
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      aRight = local_48;
      goto LAB_00ba8c87;
    }
    pRVar8 = (RecyclableObject *)SetPrototypeTrap::anon_class_40_5_61b45b38::operator()(&local_78);
    bVar3 = ThreadContext::IsOnStack(pRVar8);
  }
  if (bVar3 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00ba8c87:
  this_00->reentrancySafeOrHandled = local_31;
  uVar5 = JavascriptConversion::ToBoolean(pRVar8,requestContext);
  pRVar8 = local_40;
  iVar6 = (*(local_40->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x33])(local_40);
  if (iVar6 == 0) {
    pRVar8 = RecyclableObject::GetPrototype(pRVar8);
    bVar3 = JavascriptConversion::SameValueCommon<false>(pRVar8,aRight);
    local_32 = local_32 | bVar3;
    if (local_32 == 0) {
      JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"setPrototypeOf");
    }
    uVar5 = (uint)bVar3;
  }
  else if (uVar5 == 0 && local_32 == 0) {
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5e9f6,L"setPrototypeOf");
  }
  return uVar5;
}

Assistant:

BOOL JavascriptProxy::SetPrototypeTrap(RecyclableObject* newPrototype, bool shouldThrow,
        ScriptContext * requestContext)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);
        Assert(JavascriptOperators::IsObjectOrNull(newPrototype));

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        //1. Assert: Either Type(V) is Object or Type(V) is Null.
        //2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //3. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (shouldThrow)
            {
                if (!threadContext->RecordImplicitException())
                    return FALSE;
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("setPrototypeOf"));
            }
        }

        //4. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        //5. Let trap be the result of GetMethod(handler, "setPrototypeOf").
        //6. ReturnIfAbrupt(trap).
        //7. If trap is undefined, then
        //a.Return the result of calling the[[SetPrototypeOf]] internal method of target with argument V.
        JavascriptFunction* setPrototypeOfMethod = GetMethodHelper(PropertyIds::setPrototypeOf, requestContext);
        Assert(!GetScriptContext()->IsHeapEnumInProgress());
        if (nullptr == setPrototypeOfMethod)
        {
            JavascriptObject::ChangePrototype(targetObj, newPrototype, shouldThrow, requestContext);
            return TRUE;
        }
        //8. Let trapResult be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target and V.

        Var setPrototypeResult = threadContext->ExecuteImplicitCall(setPrototypeOfMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, setPrototypeOfMethod, CallInfo(CallFlags_Value, 3), handlerObj, targetObj, newPrototype);
        });

        //9. Let booleanTrapResult be ToBoolean(trapResult).
        //10. ReturnIfAbrupt(booleanTrapResult).
        //11. Let extensibleTarget be the result of IsExtensible(target).
        //12. ReturnIfAbrupt(extensibleTarget).
        //13. If extensibleTarget is true, then return booleanTrapResult.
        //14. Let targetProto be the result of calling the[[GetPrototypeOf]] internal method of target.
        //15. ReturnIfAbrupt(targetProto).
        //16. If booleanTrapResult is true and SameValue(V, targetProto) is false, then throw a TypeError exception.
        //17. Return booleanTrapResult.
        BOOL prototypeSetted = JavascriptConversion::ToBoolean(setPrototypeResult, requestContext);
        BOOL isExtensible = targetObj->IsExtensible();
        if (isExtensible)
        {
            if (!prototypeSetted && shouldThrow)
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_ProxyTrapReturnedFalse, _u("setPrototypeOf"));
            }
            return prototypeSetted;
        }
        Var targetProto = targetObj->GetPrototype();
        if (!JavascriptConversion::SameValue(targetProto, newPrototype))
        {
            if (shouldThrow)
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("setPrototypeOf"));
            }
            return FALSE;
        }
        return TRUE;
    }